

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::SwitchStmt::remove_stmt(SwitchStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  bool bVar1;
  reference __in;
  type *switch_case;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  StmtBlock *this_01;
  reference __a;
  shared_ptr<kratos::Stmt> *s;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  type *stmts;
  type *c;
  _Self local_30;
  iterator __end1;
  iterator __begin1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  shared_ptr<kratos::Stmt> *stmt_local;
  SwitchStmt *this_local;
  
  __end1 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin(&this->body_);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::end(&this->body_);
  do {
    bVar1 = std::operator!=(&__end1,&local_30);
    if (!bVar1) {
      return;
    }
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
           ::operator*(&__end1);
    switch_case = std::
                  get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                            (__in);
    this_00 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                           (__in);
    this_01 = &std::
               __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(this_00)->super_StmtBlock;
    __end2 = StmtBlock::begin(this_01);
    s = (shared_ptr<kratos::Stmt> *)StmtBlock::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                       *)&s), bVar1) {
      __a = __gnu_cxx::
            __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
            ::operator*(&__end2);
      bVar1 = std::operator==(__a,stmt);
      if (bVar1) {
        remove_switch_case(this,switch_case,stmt);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void SwitchStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto &[c, stmts] : body_) {
        for (auto const &s : *stmts) {
            if (s == stmt) {
                remove_switch_case(c, stmt);
                break;
            }
        }
    }
}